

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O3

void __thiscall unitStrings_downConvert_Test::TestBody(unitStrings_downConvert_Test *this)

{
  precise_unit *un;
  uint64_t in_RCX;
  char *message;
  precise_unit pVar1;
  internal local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  AssertHelper local_40;
  unit_data local_38;
  uint32_t local_34;
  string local_30;
  
  pVar1 = units::precise_unit::operator/
                    ((precise_unit *)units::precise::one,(precise_unit *)units::precise::kg);
  local_40.data_ = (AssertHelperData *)(pVar1.multiplier_ * 1000.0);
  local_38 = pVar1.base_units_;
  local_34 = pVar1.commodity_;
  un = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_30,(units *)&local_40,un,in_RCX);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            (local_50,"to_string(precise_unit(1000.0, precise::one / precise::kg))","\"1/g\"",
             &local_30,(char (*) [4])"1/g");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_48 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_48->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x145,message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((long *)local_30._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
    }
  }
  if (local_48 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_48,local_48);
  }
  return;
}

Assistant:

TEST(unitStrings, downConvert)
{
    EXPECT_EQ(
        to_string(precise_unit(1000.0, precise::one / precise::kg)), "1/g");
}